

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

uint32 Socket::inetAddr(String *addr,uint16 *port)

{
  uint uVar1;
  in_addr_t iVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  String local_40;
  
  pcVar3 = String::find(addr,':');
  if (pcVar3 == (char *)0x0) {
    pcVar3 = String::operator_cast_to_char_(addr);
    iVar2 = inet_addr(pcVar3);
    uVar5 = iVar2 >> 0x18 | (iVar2 & 0xff0000) >> 8 | (iVar2 & 0xff00) << 8 | iVar2 << 0x18;
  }
  else {
    if (port != (uint16 *)0x0) {
      uVar1 = String::toUInt(pcVar3 + 1);
      *port = (uint16)uVar1;
    }
    pcVar4 = String::operator_cast_to_char_(addr);
    String::substr(&local_40,addr,0,(long)pcVar3 - (long)pcVar4);
    pcVar3 = String::operator_cast_to_char_(&local_40);
    iVar2 = inet_addr(pcVar3);
    uVar5 = iVar2 >> 0x18 | (iVar2 & 0xff0000) >> 8 | (iVar2 & 0xff00) << 8 | iVar2 << 0x18;
    String::~String(&local_40);
  }
  return uVar5;
}

Assistant:

uint32 Socket::inetAddr(const String& addr, uint16* port)
{
  const char* portStr = addr.find(':');
  if(portStr)
  {
    if(port)
      *port = (uint16)String::toUInt(portStr + 1);
    return ntohl(inet_addr((const char*)addr.substr(0, (portStr - (const char*)addr))));
  }
  return ntohl(inet_addr((const char*)addr));
}